

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock-posix.c
# Opt level: O0

pboolean p_rwlock_writer_lock(PRWLock *lock)

{
  int iVar1;
  PRWLock *lock_local;
  
  if (lock == (PRWLock *)0x0) {
    lock_local._4_4_ = 0;
  }
  else {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)lock);
    if (iVar1 == 0) {
      lock_local._4_4_ = 1;
    }
    else {
      printf("** Error: %s **\n","PRWLock::p_rwlock_writer_lock: pthread_rwlock_wrlock() failed");
      lock_local._4_4_ = 0;
    }
  }
  return lock_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_rwlock_writer_lock (PRWLock *lock)
{
	if (P_UNLIKELY (lock == NULL))
		return FALSE;

	if (P_UNLIKELY (pthread_rwlock_wrlock (&lock->hdl) == 0))
		return TRUE;
	else {
		P_ERROR ("PRWLock::p_rwlock_writer_lock: pthread_rwlock_wrlock() failed");
		return FALSE;
	}
}